

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,char delimiter)

{
  char cVar1;
  pointer pcVar2;
  char *pcVar3;
  pointer pcVar4;
  pointer pbVar5;
  long *plVar6;
  bool bVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  void *pvVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  size_type __pos;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *__data;
  int __c;
  ulong uVar12;
  ulong uVar13;
  size_type __size;
  size_type sVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  string value;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  string delims;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it_1;
  char local_139;
  value_type local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  long *local_e8;
  size_t local_e0;
  long local_d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string *local_a8;
  size_type *local_a0;
  size_type local_98;
  size_type local_90;
  undefined8 uStack_88;
  uint local_7c;
  char *local_78;
  size_type local_70;
  char local_68;
  undefined1 uStack_67;
  undefined6 uStack_66;
  undefined1 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e8 = local_d8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"\'\"`","");
  local_50._M_dataplus._M_p = (str->_M_dataplus)._M_p;
  local_128._M_dataplus._M_p = local_50._M_dataplus._M_p + str->_M_string_length;
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_108);
  str->_M_string_length = (long)local_108._M_dataplus._M_p - (long)(str->_M_dataplus)._M_p;
  *local_108._M_dataplus._M_p = '\0';
  _Var8 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar2 = (str->_M_dataplus)._M_p;
  if (pcVar2 + str->_M_string_length == _Var8._M_current) {
    str->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
              (str,0,(long)_Var8._M_current - (long)pcVar2);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar14 = str->_M_string_length;
  if (sVar14 != 0) {
    local_139 = ' ';
    local_7c = (uint)(byte)delimiter;
    bVar7 = false;
    local_a8 = str;
    do {
      plVar6 = local_e8;
      pcVar3 = (str->_M_dataplus)._M_p;
      if (local_e0 == 0) {
LAB_001965a2:
        _Var8 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>>
                          (pcVar3,pcVar3 + sVar14,local_7c);
        str = local_a8;
        pcVar4 = ((_Alloc_hider *)&local_a8->_M_dataplus)->_M_p;
        if (_Var8._M_current == pcVar4 + local_a8->_M_string_length) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,local_a8);
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,0,
                     str->_M_string_length,"",0);
        }
        else {
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_128,pcVar4,_Var8._M_current);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_128);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_108,_Var8._M_current + 1,
                     ((_Alloc_hider *)&str->_M_dataplus)->_M_p + str->_M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (str,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        cVar1 = *pcVar3;
        __c = (int)cVar1;
        pvVar9 = memchr(local_e8,__c,local_e0);
        if ((long)pvVar9 - (long)plVar6 == -1 || pvVar9 == (void *)0x0) goto LAB_001965a2;
        uVar13 = 0xffffffffffffffff;
        if (sVar14 != 1) {
          pvVar9 = memchr(pcVar3 + 1,__c,sVar14 - 1);
          uVar13 = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)pcVar3;
        }
        str = local_a8;
        local_139 = cVar1;
        if (uVar13 == 0xffffffffffffffff) {
LAB_00196718:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_128,str,1,0xffffffffffffffff);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,0,
                     str->_M_string_length,"",0);
        }
        else {
          if (pcVar3[uVar13 - 1] == '\\') {
            do {
              uVar12 = uVar13 + 1;
              uVar13 = 0xffffffffffffffff;
              if (uVar12 <= sVar14 && sVar14 - uVar12 != 0) {
                pvVar9 = memchr(pcVar3 + uVar12,__c,sVar14 - uVar12);
                uVar13 = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)pcVar3;
              }
              if (uVar13 == 0xffffffffffffffff) {
                bVar7 = true;
                goto LAB_00196718;
              }
            } while (pcVar3[uVar13 - 1] == '\\');
            bVar7 = true;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_128,str,1,uVar13 - 1);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (uVar13 + 2 < str->_M_string_length) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_50,str,uVar13 + 2,0xffffffffffffffff);
            split_up();
          }
          else {
            str->_M_string_length = 0;
            *(str->_M_dataplus)._M_p = '\0';
          }
        }
      }
      if (bVar7) {
        pbVar5 = (__return_storage_ptr__->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        pcVar2 = pbVar5[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,pcVar2,pcVar2 + pbVar5[-1]._M_string_length);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"\\","");
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_replace_aux(&local_108,local_108._M_string_length,0,1,local_139);
        local_a0 = (size_type *)(pbVar10->_M_dataplus)._M_p;
        paVar11 = &pbVar10->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0 == paVar11) {
          local_90 = paVar11->_M_allocated_capacity;
          uStack_88 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          local_a0 = &local_90;
        }
        else {
          local_90 = paVar11->_M_allocated_capacity;
        }
        local_98 = pbVar10->_M_string_length;
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        local_78 = &local_68;
        local_68 = local_139;
        local_70 = 1;
        uStack_67 = 0;
        __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&local_c8,(char *)local_a0,0,local_98);
        sVar14 = local_c8._M_string_length;
        while (__pos != 0xffffffffffffffff) {
          local_c8._M_string_length = sVar14;
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                     __pos,local_98,local_78,local_70);
          __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(&local_c8,(char *)local_a0,__pos + local_70,local_98);
          sVar14 = local_c8._M_string_length;
        }
        local_128._M_dataplus._M_p = local_c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        local_128.field_2._M_allocated_capacity._1_7_ = local_c8.field_2._M_allocated_capacity._1_7_
        ;
        local_128.field_2._M_local_buf[0] = local_c8.field_2._M_local_buf[0];
        local_c8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        local_128._M_string_length = sVar14;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((__return_storage_ptr__->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + -1,&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,CONCAT62(uStack_66,CONCAT11(uStack_67,local_68)) + 1);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
        bVar7 = false;
      }
      local_108._M_dataplus._M_p = (str->_M_dataplus)._M_p;
      local_128._M_dataplus._M_p = local_108._M_dataplus._M_p + str->_M_string_length;
      ::std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                (&local_58,&local_128,&local_108);
      str->_M_string_length = (long)local_58 - (long)(str->_M_dataplus)._M_p;
      *local_58 = 0;
      _Var8 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                        ();
      pcVar2 = (str->_M_dataplus)._M_p;
      if (pcVar2 + str->_M_string_length == _Var8._M_current) {
        str->_M_string_length = 0;
        *pcVar2 = '\0';
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
                  (str,0,(long)_Var8._M_current - (long)pcVar2);
      }
      sVar14 = str->_M_string_length;
    } while (sVar14 != 0);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split_up(std::string str, char delimiter = '\0') {

    const std::string delims("\'\"`");
    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? (std::isspace<char>(ch, std::locale()) != 0) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    bool embeddedQuote = false;
    char keyChar = ' ';
    while(!str.empty()) {
        if(delims.find_first_of(str[0]) != std::string::npos) {
            keyChar = str[0];
            auto end = str.find_first_of(keyChar, 1);
            while((end != std::string::npos) && (str[end - 1] == '\\')) {  // deal with escaped quotes
                end = str.find_first_of(keyChar, end + 1);
                embeddedQuote = true;
            }
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                if(end + 2 < str.size()) {
                    str = str.substr(end + 2);
                } else {
                    str.clear();
                }

            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        // transform any embedded quotes into the regular character
        if(embeddedQuote) {
            output.back() = find_and_replace(output.back(), std::string("\\") + keyChar, std::string(1, keyChar));
            embeddedQuote = false;
        }
        trim(str);
    }
    return output;
}